

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void Rml::anon_unknown_0::SearchNavigationTarget
               (SearchNavigationResult *best_result,Element *element,
               NavigationSearchDirection direction,BoundingBox *bounding_box,
               Element *exclude_element)

{
  code *pcVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  bool bVar4;
  int iVar5;
  CanFocus CVar6;
  int iVar7;
  Element *element_00;
  Box *this;
  BoundingBox *a;
  Axis axis;
  anon_class_1_0_00000001 *this_00;
  int index;
  BoundingBox target_box;
  float local_48;
  float fStack_44;
  
  index = 0;
  iVar5 = Element::GetNumChildren(element,false);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  do {
    if (iVar5 == index) {
      return;
    }
    element_00 = Element::GetChild(element,index);
    if ((element_00 == exclude_element) ||
       (CVar6 = CanFocusElement(element_00), CVar6 == NoAndNoChildren)) goto LAB_0028e27e;
    if (CVar6 != Yes) {
      bVar4 = IsScrollContainer(element_00);
      if (!bVar4) goto LAB_0028e267;
      goto LAB_0028e27e;
    }
    VVar2 = Element::GetAbsoluteOffset(element_00,Border);
    this = Element::GetBox(element_00);
    VVar3 = Box::GetSize(this,Border);
    local_48 = VVar2.x;
    fStack_44 = VVar2.y;
    target_box.max.x = VVar3.x + local_48;
    target_box.max.y = VVar3.y + fStack_44;
    target_box.min.x = local_48;
    target_box.min.y = fStack_44;
    switch(direction) {
    case Up:
      this_00 = (anon_class_1_0_00000001 *)0x1;
      break;
    case Down:
      this_00 = (anon_class_1_0_00000001 *)0x1;
      goto LAB_0028e21f;
    case Left:
      this_00 = (anon_class_1_0_00000001 *)0x0;
      break;
    case Right:
      this_00 = (anon_class_1_0_00000001 *)0x0;
LAB_0028e21f:
      axis = (Axis)&target_box;
      a = bounding_box;
      goto LAB_0028e229;
    default:
      bVar4 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementDocument.cpp"
                     ,0x80);
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      goto LAB_0028e267;
    }
    axis = (Axis)bounding_box;
    a = &target_box;
LAB_0028e229:
    iVar7 = anon_func::anon_class_1_0_00000001::operator()
                      (this_00,axis,a,(BoundingBox *)&switchD_0028e1f5::switchdataD_003203bc);
    if (iVar7 < best_result->heuristic) {
      best_result->element = element_00;
      best_result->heuristic = iVar7;
    }
LAB_0028e267:
    SearchNavigationTarget(best_result,element_00,direction,bounding_box,exclude_element);
LAB_0028e27e:
    index = index + 1;
  } while( true );
}

Assistant:

void SearchNavigationTarget(SearchNavigationResult& best_result, Element* element, NavigationSearchDirection direction,
		const BoundingBox& bounding_box, Element* exclude_element)
	{
		const int num_children = element->GetNumChildren();
		for (int child_index = 0; child_index < num_children; child_index++)
		{
			Element* child = element->GetChild(child_index);
			if (child == exclude_element)
				continue;

			const CanFocus can_focus = CanFocusElement(child);
			if (can_focus == CanFocus::Yes)
			{
				const Vector2f position = child->GetAbsoluteOffset(BoxArea::Border);
				const BoundingBox target_box = {position, position + child->GetBox().GetSize(BoxArea::Border)};

				const int heuristic = GetNavigationHeuristic(bounding_box, target_box, direction);
				if (heuristic < best_result.heuristic)
				{
					best_result.element = child;
					best_result.heuristic = heuristic;
				}
			}
			else if (can_focus == CanFocus::NoAndNoChildren || IsScrollContainer(child))
			{
				continue;
			}

			SearchNavigationTarget(best_result, child, direction, bounding_box, exclude_element);
		}
	}